

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O0

ostream * __thiscall
trompeloeil::call_matcher<void_(),_std::tuple<>_>::report_signature
          (call_matcher<void_(),_std::tuple<>_> *this,ostream *os)

{
  ostream *poVar1;
  ostream *os_local;
  call_matcher<void_(),_std::tuple<>_> *this_local;
  
  poVar1 = std::operator<<(os,(this->super_call_matcher_base<void_()>).name);
  poVar1 = std::operator<<(poVar1," at ");
  poVar1 = trompeloeil::operator<<(poVar1,&(this->super_call_matcher_base<void_()>).loc);
  return poVar1;
}

Assistant:

std::ostream&
    report_signature(
      std::ostream& os)
    const override
    {
      return os << name << " at " << loc;
    }